

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O0

void __thiscall amrex::MLLinOp::AnyAvgDownResMG(MLLinOp *this,int clev,Any *cres,Any *fres)

{
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_RDI;
  IntVect *in_stack_000007d8;
  int in_stack_000007e0;
  int in_stack_000007e4;
  MultiFab *in_stack_000007e8;
  MultiFab *in_stack_000007f0;
  size_type in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  Any::get<amrex::MultiFab>((Any *)in_RDI);
  Any::get<amrex::MultiFab>((Any *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  (*(code *)(((_Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
               *)&(in_RDI->super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                  super__Vector_impl_data._M_start)->
            super__Head_base<0UL,_amrex::Any::innards_base_*,_false>)._M_head_impl[5].
            _vptr_innards_base)();
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
            (in_RDI,in_stack_ffffffffffffffb8);
  EB_average_down(in_stack_000007f0,in_stack_000007e8,in_stack_000007e4,in_stack_000007e0,
                  in_stack_000007d8);
  return;
}

Assistant:

void
MLLinOp::AnyAvgDownResMG (int clev, Any& cres, Any const& fres) const
{
    AMREX_ASSERT(cres.is<MultiFab>());
#ifdef AMREX_USE_EB
    amrex::EB_average_down
#else
    amrex::average_down
#endif
        (fres.get<MultiFab>(), cres.get<MultiFab>(), 0, getNComp(),
         mg_coarsen_ratio_vec[clev-1]);
}